

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint32_t helper_bcdcfz_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  ulong local_38;
  uint64_t uStack_30;
  
  bVar5 = 3;
  if (ps != 0) {
    bVar5 = 0xf;
  }
  local_38 = 0;
  uStack_30 = 0;
  bVar2 = b->u8[0];
  uVar7 = 0;
  do {
    bVar9 = bVar5;
    if (uVar7 != 0) {
      bVar9 = b->u8[uVar7] >> 4;
    }
    bVar4 = true;
    if (bVar9 != bVar5) break;
    bVar9 = b->u8[uVar7] & 0xf;
    if (9 < bVar9) break;
    uVar1 = uVar7 + 1;
    uVar8 = uVar1 >> 1 & 0x7fffffff;
    bVar3 = *(byte *)((long)&local_38 + uVar8);
    if ((uVar7 & 1) == 0) {
      bVar9 = b->u8[uVar7] << 4 | bVar3 & 0xf;
    }
    else {
      bVar9 = bVar3 & 0xf0 | bVar9;
    }
    *(byte *)((long)&local_38 + uVar8) = bVar9;
    uVar7 = uVar1;
    bVar4 = bVar2 < 0xa0 && ps != 0;
  } while (uVar1 != 0x10);
  if (ps == 0) {
    bVar5 = (bVar2 & 0x40) == 0 ^ 0xd;
  }
  else {
    bVar5 = ((bVar2 >> 4) - 0xb & 0xfd) == 0 | 0xc;
  }
  local_38 = CONCAT71(local_38._1_7_,(byte)local_38 & 0xf0 | bVar5);
  if ((uStack_30 == 0) && (local_38 < 0x10)) {
    uVar6 = 2;
  }
  else if ((byte)(bVar5 - 10) < 6) {
    uVar6 = *(uint32_t *)(&DAT_00dbe430 + (ulong)(byte)(bVar5 - 10) * 4);
  }
  else {
    uVar6 = 8;
  }
  if (bVar4) {
    uVar6 = 1;
  }
  r->u64[0] = local_38;
  r->u64[1] = uStack_30;
  return uVar6;
}

Assistant:

uint32_t helper_bcdcfz(ppc_avr_t *r, ppc_avr_t *b, uint32_t ps)
{
    int i;
    int cr = 0;
    int invalid = 0;
    int zone_digit = 0;
    int zone_lead = ps ? 0xF : 0x3;
    int digit = 0;
    ppc_avr_t ret = { .u64 = { 0, 0 } };
    int sgnb = b->VsrB(BCD_DIG_BYTE(0)) >> 4;

    if (unlikely((sgnb < 0xA) && ps)) {
        invalid = 1;
    }

    for (i = 0; i < 16; i++) {
        zone_digit = i ? b->VsrB(BCD_DIG_BYTE(i * 2)) >> 4 : zone_lead;
        digit = b->VsrB(BCD_DIG_BYTE(i * 2)) & 0xF;
        if (unlikely(zone_digit != zone_lead || digit > 0x9)) {
            invalid = 1;
            break;
        }

        bcd_put_digit(&ret, digit, i + 1);
    }

    if ((ps && (sgnb == 0xB || sgnb == 0xD)) ||
            (!ps && (sgnb & 0x4))) {
        bcd_put_digit(&ret, BCD_NEG_PREF, 0);
    } else {
        bcd_put_digit(&ret, BCD_PLUS_PREF_1, 0);
    }

    cr = bcd_cmp_zero(&ret);

    if (unlikely(invalid)) {
        cr = CRF_SO;
    }

    *r = ret;

    return cr;
}